

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall qpdf::BaseHandle::write_json(BaseHandle *this,int json_version,Writer *p)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *this_00;
  bool bVar1;
  qpdf_object_type_e qVar2;
  QPDF_Bool *pQVar3;
  QPDF_Integer *pQVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  QPDF_String *this_01;
  pointer pSVar8;
  reference ppVar9;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this_02;
  unique_ptr<QPDF_Stream::Members,_std::default_delete<QPDF_Stream::Members>_> *this_03;
  pointer pMVar10;
  Writer *pWVar11;
  element_type *peVar12;
  logic_error *plVar13;
  string_view sVar14;
  string local_3f0;
  string_view local_3d0;
  char local_3b9;
  string local_3b8;
  string local_398;
  string_view local_378;
  string local_368;
  string_view local_348;
  string_view local_338;
  pair<bool,_bool> local_322;
  undefined1 local_320 [6];
  pair<bool,_bool> res_1;
  string local_300;
  string_view local_2e0;
  reference local_2d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *iter;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *local_2a8;
  QPDF_Dictionary *d;
  string local_298;
  string_view local_278;
  shared_ptr<QPDFObject> local_268;
  QPDFObjGen local_258;
  QPDFObjGen item_og_1;
  QPDFObjectHandle *item_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range3_1;
  undefined1 local_228 [4];
  int j_1;
  string_view local_208;
  shared_ptr<QPDFObject> local_1f8;
  QPDFObjGen local_1e8;
  QPDFObjGen item_og;
  int j;
  int key;
  pair<const_int,_QPDFObjectHandle> *item;
  iterator __end3;
  iterator __begin3;
  map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
  *__range3;
  int next;
  QPDF_Array *a;
  string local_188;
  string_view local_168;
  string local_158;
  string_view local_138;
  string_view local_128;
  pair<bool,_bool> local_112;
  undefined1 local_110 [6];
  pair<bool,_bool> res;
  string local_f0;
  string_view local_d0;
  string *local_c0;
  QPDF_Name *n;
  char *local_b0;
  string local_a8 [32];
  string_view local_88;
  string_view local_78;
  string *local_68;
  string *val;
  string_view local_40;
  Writer *local_20;
  Writer *p_local;
  BaseHandle *pBStack_10;
  int json_version_local;
  BaseHandle *this_local;
  
  local_20 = p;
  p_local._4_4_ = json_version;
  pBStack_10 = this;
  qVar2 = resolved_type_code(this);
  pWVar11 = local_20;
  switch(qVar2) {
  case ot_uninitialized:
    plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (plVar13,"QPDFObjectHandle: attempting to get JSON from a uninitialized object");
    __cxa_throw(plVar13,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  default:
    plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar13,"attempted to write an unsuitable object as JSON");
    __cxa_throw(plVar13,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case ot_null:
  case ot_operator:
  case ot_inlineimage:
    JSON::Writer::operator<<(local_20,"null");
    break;
  case ot_boolean:
    peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    pQVar3 = std::
             get<QPDF_Bool,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&peVar12->value);
    JSON::Writer::operator<<(pWVar11,(bool)(pQVar3->val & 1));
    break;
  case ot_integer:
    peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    pQVar4 = std::
             get<QPDF_Integer,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&peVar12->value);
    std::__cxx11::to_string((string *)&val,pQVar4->val);
    local_40 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&val)
    ;
    JSON::Writer::operator<<(pWVar11,local_40);
    std::__cxx11::string::~string((string *)&val);
    break;
  case ot_real:
    peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    local_68 = (string *)
               std::
               get<QPDF_Real,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         (&peVar12->value);
    lVar5 = std::__cxx11::string::length();
    if (lVar5 == 0) {
      JSON::Writer::operator<<(local_20,"0");
    }
    else {
      pcVar7 = (char *)std::__cxx11::string::at((ulong)local_68);
      if (*pcVar7 == '.') {
        pWVar11 = JSON::Writer::operator<<(local_20,"0");
        local_78 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_68);
        JSON::Writer::operator<<(pWVar11,local_78);
      }
      else {
        uVar6 = std::__cxx11::string::length();
        if (((uVar6 < 2) ||
            (pcVar7 = (char *)std::__cxx11::string::at((ulong)local_68), *pcVar7 != '-')) ||
           (pcVar7 = (char *)std::__cxx11::string::at((ulong)local_68), *pcVar7 != '.')) {
          pWVar11 = local_20;
          sVar14 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_68);
          local_b0 = sVar14._M_str;
          n = (QPDF_Name *)sVar14._M_len;
          JSON::Writer::operator<<(pWVar11,sVar14);
        }
        else {
          pWVar11 = JSON::Writer::operator<<(local_20,"-0.");
          std::__cxx11::string::substr((ulong)local_a8,(ulong)local_68);
          local_88 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_a8)
          ;
          JSON::Writer::operator<<(pWVar11,local_88);
          std::__cxx11::string::~string(local_a8);
        }
      }
    }
    pcVar7 = (char *)std::__cxx11::string::back();
    if (*pcVar7 == '.') {
      JSON::Writer::operator<<(local_20,"0");
    }
    break;
  case ot_string:
    peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    this_01 = std::
              get<QPDF_String,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&peVar12->value);
    QPDF_String::writeJSON(this_01,p_local._4_4_,local_20);
    break;
  case ot_name:
    peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    local_c0 = &std::
                get<QPDF_Name,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                          (&peVar12->value)->name;
    if (p_local._4_4_ == 1) {
      pWVar11 = JSON::Writer::operator<<(local_20,"\"");
      Name::normalize((string *)local_110,local_c0);
      JSON::Writer::encode_string(&local_f0,(string *)local_110);
      local_d0 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_f0);
      pWVar11 = JSON::Writer::operator<<(pWVar11,local_d0);
      JSON::Writer::operator<<(pWVar11,"\"");
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)local_110);
    }
    else {
      local_112 = Name::analyzeJSONEncoding(local_c0);
      if (((ushort)local_112 & 1) == 0) {
        pWVar11 = JSON::Writer::operator<<(local_20,"\"n:");
        Name::normalize((string *)&a,local_c0);
        JSON::Writer::encode_string(&local_188,(string *)&a);
        local_168 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_188);
        pWVar11 = JSON::Writer::operator<<(pWVar11,local_168);
        JSON::Writer::operator<<(pWVar11,"\"");
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&a);
      }
      else if (((ushort)local_112 & 0x100) == 0) {
        pWVar11 = JSON::Writer::operator<<(local_20,"\"");
        JSON::Writer::encode_string(&local_158,local_c0);
        local_138 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_158);
        pWVar11 = JSON::Writer::operator<<(pWVar11,local_138);
        JSON::Writer::operator<<(pWVar11,"\"");
        std::__cxx11::string::~string((string *)&local_158);
      }
      else {
        pWVar11 = JSON::Writer::operator<<(local_20,"\"");
        local_128 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_c0);
        pWVar11 = JSON::Writer::operator<<(pWVar11,local_128);
        JSON::Writer::operator<<(pWVar11,"\"");
      }
    }
    break;
  case ot_array:
    peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    _next = std::
            get<QPDF_Array,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                      (&peVar12->value);
    __range3._7_1_ = 0x5b;
    JSON::Writer::writeStart(local_20,(char *)((long)&__range3 + 7));
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)_next);
    if (bVar1) {
      __range3._0_4_ = 0;
      pSVar8 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
               operator->(&_next->sp);
      __end3 = std::
               map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
               ::begin(&pSVar8->elements);
      item = (pair<const_int,_QPDFObjectHandle> *)
             std::
             map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
             ::end(&pSVar8->elements);
      while( true ) {
        bVar1 = std::operator!=(&__end3,(_Self *)&item);
        if (!bVar1) break;
        ppVar9 = std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>::operator*(&__end3)
        ;
        item_og.gen = ppVar9->first;
        for (item_og.obj = (int)__range3; item_og.obj < item_og.gen; item_og.obj = item_og.obj + 1)
        {
          pWVar11 = JSON::Writer::writeNext(local_20);
          JSON::Writer::operator<<(pWVar11,"null");
        }
        JSON::Writer::writeNext(local_20);
        QPDFObjectHandle::getObj((QPDFObjectHandle *)&local_1f8);
        peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_1f8);
        local_1e8 = QPDFObject::getObjGen(peVar12);
        std::shared_ptr<QPDFObject>::~shared_ptr(&local_1f8);
        bVar1 = QPDFObjGen::isIndirect(&local_1e8);
        if (bVar1) {
          pWVar11 = JSON::Writer::operator<<(local_20,"\"");
          QPDFObjGen::unparse_abi_cxx11_((string *)local_228,&local_1e8,' ');
          sVar14 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_228);
          local_208 = sVar14;
          pWVar11 = JSON::Writer::operator<<(pWVar11,sVar14);
          JSON::Writer::operator<<(pWVar11," R\"");
          std::__cxx11::string::~string((string *)local_228);
        }
        else {
          write_json(&(ppVar9->second).super_BaseHandle,p_local._4_4_,local_20);
        }
        item_og.gen = item_og.gen + 1;
        __range3._0_4_ = item_og.gen;
        std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>::operator++(&__end3);
      }
      __range3_1._4_4_ = (int)__range3;
      while( true ) {
        pSVar8 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
                 operator->(&_next->sp);
        if (pSVar8->size <= __range3_1._4_4_) break;
        pWVar11 = JSON::Writer::writeNext(local_20);
        JSON::Writer::operator<<(pWVar11,"null");
        __range3_1._4_4_ = __range3_1._4_4_ + 1;
      }
    }
    else {
      this_02 = &_next->elements;
      __end3_1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin(this_02);
      item_1 = (QPDFObjectHandle *)
               std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end(this_02);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3_1,
                           (__normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                            *)&item_1);
        if (!bVar1) break;
        item_og_1 = (QPDFObjGen)
                    __gnu_cxx::
                    __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                    ::operator*(&__end3_1);
        JSON::Writer::writeNext(local_20);
        QPDFObjectHandle::getObj((QPDFObjectHandle *)&local_268);
        peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_268);
        local_258 = QPDFObject::getObjGen(peVar12);
        std::shared_ptr<QPDFObject>::~shared_ptr(&local_268);
        bVar1 = QPDFObjGen::isIndirect(&local_258);
        if (bVar1) {
          pWVar11 = JSON::Writer::operator<<(local_20,"\"");
          QPDFObjGen::unparse_abi_cxx11_(&local_298,&local_258,' ');
          sVar14 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_298);
          local_278 = sVar14;
          pWVar11 = JSON::Writer::operator<<(pWVar11,sVar14);
          JSON::Writer::operator<<(pWVar11," R\"");
          std::__cxx11::string::~string((string *)&local_298);
        }
        else {
          write_json((BaseHandle *)item_og_1,p_local._4_4_,local_20);
        }
        __gnu_cxx::
        __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
        ::operator++(&__end3_1);
      }
    }
    d._7_1_ = 0x5d;
    JSON::Writer::writeEnd(local_20,(char *)((long)&d + 7));
    break;
  case ot_dictionary:
    peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    local_2a8 = &std::
                 get<QPDF_Dictionary,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                           (&peVar12->value)->items;
    __range2._7_1_ = 0x7b;
    JSON::Writer::writeStart(local_20,(char *)((long)&__range2 + 7));
    this_00 = local_2a8;
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
             ::begin(local_2a8);
    iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
              ::end(this_00);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&iter);
      if (!bVar1) break;
      local_2d0 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
                  ::operator*(&__end2);
      bVar1 = null(&(local_2d0->second).super_BaseHandle);
      if (!bVar1) {
        JSON::Writer::writeNext(local_20);
        if (p_local._4_4_ == 1) {
          pWVar11 = JSON::Writer::operator<<(local_20,"\"");
          Name::normalize((string *)local_320,&local_2d0->first);
          JSON::Writer::encode_string(&local_300,(string *)local_320);
          sVar14 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_300);
          local_2e0 = sVar14;
          pWVar11 = JSON::Writer::operator<<(pWVar11,sVar14);
          JSON::Writer::operator<<(pWVar11,"\": ");
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)local_320);
        }
        else {
          local_322 = Name::analyzeJSONEncoding(&local_2d0->first);
          if (((ushort)local_322 & 1) == 0) {
            pWVar11 = JSON::Writer::operator<<(local_20,"\"n:");
            Name::normalize(&local_3b8,&local_2d0->first);
            JSON::Writer::encode_string(&local_398,&local_3b8);
            sVar14 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_398);
            local_378 = sVar14;
            pWVar11 = JSON::Writer::operator<<(pWVar11,sVar14);
            JSON::Writer::operator<<(pWVar11,"\": ");
            std::__cxx11::string::~string((string *)&local_398);
            std::__cxx11::string::~string((string *)&local_3b8);
          }
          else if (((ushort)local_322 & 0x100) == 0) {
            pWVar11 = JSON::Writer::operator<<(local_20,"\"");
            JSON::Writer::encode_string(&local_368,&local_2d0->first);
            sVar14 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_368);
            local_348 = sVar14;
            pWVar11 = JSON::Writer::operator<<(pWVar11,sVar14);
            JSON::Writer::operator<<(pWVar11,"\": ");
            std::__cxx11::string::~string((string *)&local_368);
          }
          else {
            pWVar11 = JSON::Writer::operator<<(local_20,"\"");
            sVar14 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2d0);
            local_338 = sVar14;
            pWVar11 = JSON::Writer::operator<<(pWVar11,sVar14);
            JSON::Writer::operator<<(pWVar11,"\": ");
          }
        }
        QPDFObjectHandle::writeJSON(&local_2d0->second,p_local._4_4_,local_20,false);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::operator++(&__end2);
    }
    local_3b9 = '}';
    JSON::Writer::writeEnd(local_20,&local_3b9);
    break;
  case ot_stream:
    peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    this_03 = &std::
               get<QPDF_Stream,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         (&peVar12->value)->m;
    pMVar10 = std::unique_ptr<QPDF_Stream::Members,_std::default_delete<QPDF_Stream::Members>_>::
              operator->(this_03);
    QPDFObjectHandle::writeJSON(&pMVar10->stream_dict,p_local._4_4_,local_20,false);
    break;
  case ot_reference:
    pWVar11 = JSON::Writer::operator<<(local_20,"\"");
    peVar12 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    QPDFObjGen::unparse_abi_cxx11_(&local_3f0,&peVar12->og,' ');
    local_3d0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3f0);
    pWVar11 = JSON::Writer::operator<<(pWVar11,local_3d0);
    JSON::Writer::operator<<(pWVar11," R\"");
    std::__cxx11::string::~string((string *)&local_3f0);
  }
  return;
}

Assistant:

void
BaseHandle::write_json(int json_version, JSON::Writer& p) const
{
    switch (resolved_type_code()) {
    case ::ot_uninitialized:
        throw std::logic_error(
            "QPDFObjectHandle: attempting to get JSON from a uninitialized object");
        break; // unreachable
    case ::ot_null:
    case ::ot_operator:
    case ::ot_inlineimage:
        p << "null";
        break;
    case ::ot_boolean:
        p << std::get<QPDF_Bool>(obj->value).val;
        break;
    case ::ot_integer:
        p << std::to_string(std::get<QPDF_Integer>(obj->value).val);
        break;
    case ::ot_real:
        {
            auto const& val = std::get<QPDF_Real>(obj->value).val;
            if (val.length() == 0) {
                // Can't really happen...
                p << "0";
            } else if (val.at(0) == '.') {
                p << "0" << val;
            } else if (val.length() >= 2 && val.at(0) == '-' && val.at(1) == '.') {
                p << "-0." << val.substr(2);
            } else {
                p << val;
            }
            if (val.back() == '.') {
                p << "0";
            }
        }
        break;
    case ::ot_string:
        std::get<QPDF_String>(obj->value).writeJSON(json_version, p);
        break;
    case ::ot_name:
        {
            auto const& n = std::get<QPDF_Name>(obj->value);
            // For performance reasons this code is duplicated in QPDF_Dictionary::writeJSON. When
            // updating this method make sure QPDF_Dictionary is also update.
            if (json_version == 1) {
                p << "\"" << JSON::Writer::encode_string(Name::normalize(n.name)) << "\"";
            } else {
                if (auto res = Name::analyzeJSONEncoding(n.name); res.first) {
                    if (res.second) {
                        p << "\"" << n.name << "\"";
                    } else {
                        p << "\"" << JSON::Writer::encode_string(n.name) << "\"";
                    }
                } else {
                    p << "\"n:" << JSON::Writer::encode_string(Name::normalize(n.name)) << "\"";
                }
            }
        }
        break;
    case ::ot_array:
        {
            auto const& a = std::get<QPDF_Array>(obj->value);
            p.writeStart('[');
            if (a.sp) {
                int next = 0;
                for (auto& item: a.sp->elements) {
                    int key = item.first;
                    for (int j = next; j < key; ++j) {
                        p.writeNext() << "null";
                    }
                    p.writeNext();
                    auto item_og = item.second.getObj()->getObjGen();
                    if (item_og.isIndirect()) {
                        p << "\"" << item_og.unparse(' ') << " R\"";
                    } else {
                        item.second.write_json(json_version, p);
                    }
                    next = ++key;
                }
                for (int j = next; j < a.sp->size; ++j) {
                    p.writeNext() << "null";
                }
            } else {
                for (auto const& item: a.elements) {
                    p.writeNext();
                    auto item_og = item.getObj()->getObjGen();
                    if (item_og.isIndirect()) {
                        p << "\"" << item_og.unparse(' ') << " R\"";
                    } else {
                        item.write_json(json_version, p);
                    }
                }
            }
            p.writeEnd(']');
        }
        break;
    case ::ot_dictionary:
        {
            auto const& d = std::get<QPDF_Dictionary>(obj->value);
            p.writeStart('{');
            for (auto& iter: d.items) {
                if (!iter.second.null()) {
                    p.writeNext();
                    if (json_version == 1) {
                        p << "\"" << JSON::Writer::encode_string(Name::normalize(iter.first))
                          << "\": ";
                    } else if (auto res = Name::analyzeJSONEncoding(iter.first); res.first) {
                        if (res.second) {
                            p << "\"" << iter.first << "\": ";
                        } else {
                            p << "\"" << JSON::Writer::encode_string(iter.first) << "\": ";
                        }
                    } else {
                        p << "\"n:" << JSON::Writer::encode_string(Name::normalize(iter.first))
                          << "\": ";
                    }
                    iter.second.writeJSON(json_version, p);
                }
            }
            p.writeEnd('}');
        }
        break;
    case ::ot_stream:
        std::get<QPDF_Stream>(obj->value).m->stream_dict.writeJSON(json_version, p);
        break;
    case ::ot_reference:
        p << "\"" << obj->og.unparse(' ') << " R\"";
        break;
    default:
        throw std::logic_error("attempted to write an unsuitable object as JSON");
    }
}